

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.cc
# Opt level: O1

void __thiscall AGC::work(AGC *this,size_t nsamples,complex<float> *ci,complex<float> *co)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  
  if (nsamples != 0) {
    uVar1 = 0;
    do {
      fVar2 = this->gain_ * (float)ci[uVar1]._M_value;
      co[uVar1]._M_value = CONCAT44(this->gain_ * (float)(ci[uVar1]._M_value >> 0x20),fVar2);
      co[uVar1 + 1]._M_value =
           CONCAT44(this->gain_ * (float)(ci[uVar1 + 1]._M_value >> 0x20),
                    this->gain_ * (float)ci[uVar1 + 1]._M_value);
      co[uVar1 + 2]._M_value =
           CONCAT44(this->gain_ * (float)(ci[uVar1 + 2]._M_value >> 0x20),
                    this->gain_ * (float)ci[uVar1 + 2]._M_value);
      co[uVar1 + 3]._M_value =
           CONCAT44(this->gain_ * (float)(ci[uVar1 + 3]._M_value >> 0x20),
                    this->gain_ * (float)ci[uVar1 + 3]._M_value);
      fVar3 = this->alpha_;
      fVar2 = cabsf(fVar2);
      fVar3 = this->gain_ + (0.5 - fVar2) * fVar3;
      fVar2 = this->min_;
      if (this->min_ <= fVar3) {
        fVar2 = fVar3;
      }
      fVar3 = this->max_;
      if (fVar2 <= this->max_) {
        fVar3 = fVar2;
      }
      this->gain_ = fVar3;
      uVar1 = uVar1 + 4;
    } while (uVar1 < nsamples);
  }
  return;
}

Assistant:

void AGC::work(
    size_t nsamples,
    std::complex<float>* ci,
    std::complex<float>* co) {
  // Process 4 samples at a time.
  for (size_t i = 0; i < nsamples; i += 4) {
    // Apply gain
    co[i+0] = ci[i+0] * gain_;
    co[i+1] = ci[i+1] * gain_;
    co[i+2] = ci[i+2] * gain_;
    co[i+3] = ci[i+3] * gain_;

    // Update gain.
    // Use only the first sample and ignore the others.
    gain_ += alpha_ * (0.5 - abs(co[i]));
    gain_ = std::max(gain_, min_);
    gain_ = std::min(gain_, max_);
  }
}